

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_vpeconf0_mipsel(CPUMIPSState_conflict2 *env,target_ulong_conflict arg1)

{
  uint local_18;
  uint32_t newval;
  uint32_t mask;
  target_ulong_conflict arg1_local;
  CPUMIPSState_conflict2 *env_local;
  
  local_18 = 0;
  if ((env->CP0_VPEConf0 & 2U) != 0) {
    if ((env->CP0_VPEConf0 & 1U) != 0) {
      local_18 = 0x1fe00000;
    }
    local_18 = local_18 | 3;
  }
  env->CP0_VPEConf0 = env->CP0_VPEConf0 & (local_18 ^ 0xffffffff) | arg1 & local_18;
  return;
}

Assistant:

void helper_mtc0_vpeconf0(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask = 0;
    uint32_t newval;

    if (env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) {
        if (env->CP0_VPEConf0 & (1 << CP0VPEC0_VPA)) {
            mask |= (0xff << CP0VPEC0_XTC);
        }
        mask |= (1 << CP0VPEC0_MVP) | (1 << CP0VPEC0_VPA);
    }
    newval = (env->CP0_VPEConf0 & ~mask) | (arg1 & mask);

    /* TODO: TC exclusive handling due to ERL/EXL. */

    env->CP0_VPEConf0 = newval;
}